

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdmainct.c
# Opt level: O1

void process_data_context_main
               (j_decompress_ptr cinfo,JSAMPARRAY output_buf,JDIMENSION *out_row_ctr,
               JDIMENSION out_rows_avail)

{
  int *piVar1;
  int iVar2;
  jpeg_d_main_controller *pjVar3;
  jpeg_d_main_controller *pjVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  uint uVar13;
  long lVar14;
  uint uVar15;
  ulong uVar16;
  jpeg_component_info *pjVar17;
  long lVar18;
  
  pjVar3 = cinfo->main;
  if (*(int *)&pjVar3[6].start_pass == 0) {
    iVar7 = (*cinfo->coef->decompress_data)
                      (cinfo,(JSAMPIMAGE)(&pjVar3[6].process_data)[*(int *)&pjVar3[7].process_data])
    ;
    if (iVar7 == 0) {
      return;
    }
    *(undefined4 *)&pjVar3[6].start_pass = 1;
    piVar1 = (int *)((long)&pjVar3[8].start_pass + 4);
    *piVar1 = *piVar1 + 1;
  }
  iVar7 = *(int *)((long)&pjVar3[7].process_data + 4);
  if (iVar7 != 0) {
    if (iVar7 == 1) goto LAB_00108539;
    if (iVar7 != 2) {
      return;
    }
    (*cinfo->post->post_process_data)
              (cinfo,(JSAMPIMAGE)(&pjVar3[6].process_data)[*(int *)&pjVar3[7].process_data],
               (JDIMENSION *)((long)&pjVar3[6].start_pass + 4),*(JDIMENSION *)&pjVar3[8].start_pass,
               output_buf,out_row_ctr,out_rows_avail);
    if (*(uint *)((long)&pjVar3[6].start_pass + 4) < *(uint *)&pjVar3[8].start_pass) {
      return;
    }
    *(undefined4 *)((long)&pjVar3[7].process_data + 4) = 0;
    if (out_rows_avail <= *out_row_ctr) {
      return;
    }
  }
  *(undefined4 *)((long)&pjVar3[6].start_pass + 4) = 0;
  iVar7 = cinfo->min_DCT_v_scaled_size;
  *(int *)&pjVar3[8].start_pass = iVar7 + -1;
  if ((*(JDIMENSION *)((long)&pjVar3[8].start_pass + 4) == cinfo->total_iMCU_rows) &&
     (iVar2 = cinfo->num_components, 0 < (long)iVar2)) {
    pjVar17 = cinfo->comp_info;
    pjVar4 = cinfo->main;
    iVar8 = *(int *)&pjVar4[7].process_data;
    lVar18 = 0;
    do {
      uVar15 = pjVar17->DCT_v_scaled_size * pjVar17->v_samp_factor;
      iVar9 = (int)uVar15 / iVar7;
      uVar13 = pjVar17->downsampled_height % uVar15;
      if (uVar13 != 0) {
        uVar15 = uVar13;
      }
      if (lVar18 == 0) {
        *(int *)&pjVar4[8].start_pass = (int)(uVar15 - 1) / iVar9 + 1;
      }
      if (0 < iVar9) {
        lVar5 = *(long *)((&pjVar4[6].process_data)[iVar8] + lVar18 * 8);
        uVar10 = (ulong)(uint)(iVar9 * 2);
        if (iVar9 * 2 < 2) {
          uVar10 = 1;
        }
        uVar16 = 0;
        do {
          *(undefined8 *)(lVar5 + (long)(int)uVar15 * 8 + uVar16 * 8) =
               *(undefined8 *)(lVar5 + -8 + (long)(int)uVar15 * 8);
          uVar16 = uVar16 + 1;
        } while (uVar10 != uVar16);
      }
      lVar18 = lVar18 + 1;
      pjVar17 = pjVar17 + 1;
    } while (lVar18 != iVar2);
  }
  *(undefined4 *)((long)&pjVar3[7].process_data + 4) = 1;
LAB_00108539:
  (*cinfo->post->post_process_data)
            (cinfo,(JSAMPIMAGE)(&pjVar3[6].process_data)[*(int *)&pjVar3[7].process_data],
             (JDIMENSION *)((long)&pjVar3[6].start_pass + 4),*(JDIMENSION *)&pjVar3[8].start_pass,
             output_buf,out_row_ctr,out_rows_avail);
  if (*(uint *)&pjVar3[8].start_pass <= *(uint *)((long)&pjVar3[6].start_pass + 4)) {
    if ((*(int *)((long)&pjVar3[8].start_pass + 4) == 1) &&
       (iVar7 = cinfo->num_components, 0 < (long)iVar7)) {
      iVar2 = cinfo->min_DCT_v_scaled_size;
      pjVar17 = cinfo->comp_info;
      pjVar4 = cinfo->main;
      lVar18 = 0;
      do {
        uVar10 = (long)(pjVar17->DCT_v_scaled_size * pjVar17->v_samp_factor) / (long)iVar2;
        iVar8 = (int)uVar10;
        if (0 < iVar8) {
          lVar5 = *(long *)(pjVar4[6].process_data + lVar18 * 8);
          lVar6 = *(long *)(pjVar4[7].start_pass + lVar18 * 8);
          lVar11 = (long)(iVar8 * (iVar2 + 1));
          uVar10 = uVar10 & 0xffffffff;
          lVar14 = (long)(iVar8 * (iVar2 + 2));
          lVar12 = 0;
          do {
            *(undefined8 *)(lVar5 + uVar10 * -8 + lVar12) =
                 *(undefined8 *)(lVar5 + lVar11 * 8 + lVar12);
            *(undefined8 *)(lVar6 + uVar10 * -8 + lVar12) =
                 *(undefined8 *)(lVar6 + lVar11 * 8 + lVar12);
            *(undefined8 *)(lVar5 + lVar14 * 8 + lVar12) = *(undefined8 *)(lVar5 + lVar12);
            *(undefined8 *)(lVar6 + lVar14 * 8 + lVar12) = *(undefined8 *)(lVar6 + lVar12);
            lVar12 = lVar12 + 8;
          } while (uVar10 * 8 != lVar12);
        }
        lVar18 = lVar18 + 1;
        pjVar17 = pjVar17 + 1;
      } while (lVar18 != iVar7);
    }
    *(byte *)&pjVar3[7].process_data = *(byte *)&pjVar3[7].process_data ^ 1;
    *(undefined4 *)&pjVar3[6].start_pass = 0;
    iVar7 = cinfo->min_DCT_v_scaled_size;
    *(int *)((long)&pjVar3[6].start_pass + 4) = iVar7 + 1;
    *(int *)&pjVar3[8].start_pass = iVar7 + 2;
    *(undefined4 *)((long)&pjVar3[7].process_data + 4) = 2;
  }
  return;
}

Assistant:

METHODDEF(void)
process_data_context_main (j_decompress_ptr cinfo,
			   JSAMPARRAY output_buf, JDIMENSION *out_row_ctr,
			   JDIMENSION out_rows_avail)
{
  my_main_ptr main = (my_main_ptr) cinfo->main;

  /* Read input data if we haven't filled the main buffer yet */
  if (! main->buffer_full) {
    if (! (*cinfo->coef->decompress_data) (cinfo,
					   main->xbuffer[main->whichptr]))
      return;			/* suspension forced, can do nothing more */
    main->buffer_full = TRUE;	/* OK, we have an iMCU row to work with */
    main->iMCU_row_ctr++;	/* count rows received */
  }

  /* Postprocessor typically will not swallow all the input data it is handed
   * in one call (due to filling the output buffer first).  Must be prepared
   * to exit and restart.  This switch lets us keep track of how far we got.
   * Note that each case falls through to the next on successful completion.
   */
  switch (main->context_state) {
  case CTX_POSTPONED_ROW:
    /* Call postprocessor using previously set pointers for postponed row */
    (*cinfo->post->post_process_data) (cinfo, main->xbuffer[main->whichptr],
			&main->rowgroup_ctr, main->rowgroups_avail,
			output_buf, out_row_ctr, out_rows_avail);
    if (main->rowgroup_ctr < main->rowgroups_avail)
      return;			/* Need to suspend */
    main->context_state = CTX_PREPARE_FOR_IMCU;
    if (*out_row_ctr >= out_rows_avail)
      return;			/* Postprocessor exactly filled output buf */
    /*FALLTHROUGH*/
  case CTX_PREPARE_FOR_IMCU:
    /* Prepare to process first M-1 row groups of this iMCU row */
    main->rowgroup_ctr = 0;
    main->rowgroups_avail = (JDIMENSION) (cinfo->min_DCT_v_scaled_size - 1);
    /* Check for bottom of image: if so, tweak pointers to "duplicate"
     * the last sample row, and adjust rowgroups_avail to ignore padding rows.
     */
    if (main->iMCU_row_ctr == cinfo->total_iMCU_rows)
      set_bottom_pointers(cinfo);
    main->context_state = CTX_PROCESS_IMCU;
    /*FALLTHROUGH*/
  case CTX_PROCESS_IMCU:
    /* Call postprocessor using previously set pointers */
    (*cinfo->post->post_process_data) (cinfo, main->xbuffer[main->whichptr],
			&main->rowgroup_ctr, main->rowgroups_avail,
			output_buf, out_row_ctr, out_rows_avail);
    if (main->rowgroup_ctr < main->rowgroups_avail)
      return;			/* Need to suspend */
    /* After the first iMCU, change wraparound pointers to normal state */
    if (main->iMCU_row_ctr == 1)
      set_wraparound_pointers(cinfo);
    /* Prepare to load new iMCU row using other xbuffer list */
    main->whichptr ^= 1;	/* 0=>1 or 1=>0 */
    main->buffer_full = FALSE;
    /* Still need to process last row group of this iMCU row, */
    /* which is saved at index M+1 of the other xbuffer */
    main->rowgroup_ctr = (JDIMENSION) (cinfo->min_DCT_v_scaled_size + 1);
    main->rowgroups_avail = (JDIMENSION) (cinfo->min_DCT_v_scaled_size + 2);
    main->context_state = CTX_POSTPONED_ROW;
  }
}